

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O0

void __thiscall
wasm::BinaryenIRWriter<wasm::BinaryenIRToBinaryWriter>::visitPossibleBlockContents
          (BinaryenIRWriter<wasm::BinaryenIRToBinaryWriter> *this,Expression *curr)

{
  Expression *tree;
  bool bVar1;
  BranchSeeker *this_00;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_01;
  Expression **ppEVar2;
  Name target;
  BasicType local_64;
  Expression *local_60;
  Expression *child;
  Iterator __end2;
  Iterator __begin2;
  ExpressionList *__range2;
  Block *block;
  Expression *curr_local;
  BinaryenIRWriter<wasm::BinaryenIRToBinaryWriter> *this_local;
  
  this_00 = (BranchSeeker *)Expression::dynCast<wasm::Block>(curr);
  if ((this_00 == (BranchSeeker *)0x0) ||
     (tree = (Expression *)
             (this_00->
             super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
             ).
             super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
             .stack.fixed._M_elems[0].func, target.super_IString.str._M_str = (char *)tree,
     target.super_IString.str._M_len =
          (size_t)(this_00->
                  super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                  ).
                  super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                  .stack.fixed._M_elems[0].currp,
     bVar1 = BranchUtils::BranchSeeker::has(this_00,tree,target), bVar1)) {
    visit(this,curr);
  }
  else {
    this_01 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
              ((this_00->
               super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
               ).
               super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
               .stack.fixed._M_elems + 1);
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin(this_01);
    _child = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end(this_01);
    while (bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end2.index,(Iterator *)&child), bVar1) {
      ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)&__end2.index);
      local_60 = *ppEVar2;
      visit(this,local_60);
      local_64 = unreachable;
      bVar1 = wasm::Type::operator==(&local_60->type,&local_64);
      if (bVar1) {
        return;
      }
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end2.index);
    }
  }
  return;
}

Assistant:

void BinaryenIRWriter<SubType>::visitPossibleBlockContents(Expression* curr) {
  auto* block = curr->dynCast<Block>();
  // Even if the block has a name, check if the name is necessary (if it has no
  // uses, it is equivalent to not having one). Scanning the children of the
  // block means that this takes quadratic time, but it will be N^2 for a fairly
  // small N since the number of nested non-block control flow structures tends
  // to be very reasonable.
  if (!block || BranchUtils::BranchSeeker::has(block, block->name)) {
    visit(curr);
    return;
  }
  for (auto* child : block->list) {
    visit(child);
    // Since this child was unreachable, either this child or one of its
    // descendants was a source of unreachability that was actually
    // emitted. Subsequent children won't be reachable, so skip them.
    if (child->type == Type::unreachable) {
      break;
    }
  }
}